

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestEmptyBinaryDirectoryCommand.h
# Opt level: O0

unique_ptr<cmCommand,_std::default_delete<cmCommand>_> __thiscall
cmCTestEmptyBinaryDirectoryCommand::Clone(cmCTestEmptyBinaryDirectoryCommand *this)

{
  cmCTest *pcVar1;
  cmCTestScriptHandler *pcVar2;
  pointer pcVar3;
  long in_RSI;
  unique_ptr<cmCTestEmptyBinaryDirectoryCommand,_std::default_delete<cmCTestEmptyBinaryDirectoryCommand>_>
  local_20;
  __single_object ni;
  cmCTestEmptyBinaryDirectoryCommand *this_local;
  
  std::make_unique<cmCTestEmptyBinaryDirectoryCommand>();
  pcVar1 = *(cmCTest **)(in_RSI + 0x18);
  pcVar3 = std::
           unique_ptr<cmCTestEmptyBinaryDirectoryCommand,_std::default_delete<cmCTestEmptyBinaryDirectoryCommand>_>
           ::operator->(&local_20);
  (pcVar3->super_cmCTestCommand).CTest = pcVar1;
  pcVar2 = *(cmCTestScriptHandler **)(in_RSI + 0x20);
  pcVar3 = std::
           unique_ptr<cmCTestEmptyBinaryDirectoryCommand,_std::default_delete<cmCTestEmptyBinaryDirectoryCommand>_>
           ::operator->(&local_20);
  (pcVar3->super_cmCTestCommand).CTestScriptHandler = pcVar2;
  std::unique_ptr<cmCommand,std::default_delete<cmCommand>>::
  unique_ptr<cmCTestEmptyBinaryDirectoryCommand,std::default_delete<cmCTestEmptyBinaryDirectoryCommand>,void>
            ((unique_ptr<cmCommand,std::default_delete<cmCommand>> *)this,&local_20);
  std::
  unique_ptr<cmCTestEmptyBinaryDirectoryCommand,_std::default_delete<cmCTestEmptyBinaryDirectoryCommand>_>
  ::~unique_ptr(&local_20);
  return (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)
         (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)this;
}

Assistant:

std::unique_ptr<cmCommand> Clone() override
  {
    auto ni = cm::make_unique<cmCTestEmptyBinaryDirectoryCommand>();
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return std::unique_ptr<cmCommand>(std::move(ni));
  }